

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ustring.cpp
# Opt level: O0

int32_t u_strncmp_63(UChar *s1,UChar *s2,int32_t n)

{
  int local_24;
  int32_t rc;
  int32_t n_local;
  UChar *s2_local;
  UChar *s1_local;
  
  local_24 = n;
  _rc = s2;
  s2_local = s1;
  if (n < 1) {
    s1_local._4_4_ = 0;
  }
  else {
    while (((s1_local._4_4_ = (uint)(ushort)*s2_local - (uint)(ushort)*_rc, s1_local._4_4_ == 0 &&
            (*s2_local != L'\0')) && (local_24 = local_24 + -1, local_24 != 0))) {
      s2_local = s2_local + 1;
      _rc = _rc + 1;
    }
  }
  return s1_local._4_4_;
}

Assistant:

U_CAPI int32_t   U_EXPORT2
u_strncmp(const UChar     *s1, 
     const UChar     *s2, 
     int32_t     n) 
{
    if(n > 0) {
        int32_t rc;
        for(;;) {
            rc = (int32_t)*s1 - (int32_t)*s2;
            if(rc != 0 || *s1 == 0 || --n == 0) {
                return rc;
            }
            ++s1;
            ++s2;
        }
    } else {
        return 0;
    }
}